

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NetworkBroker_impl.hpp
# Opt level: O0

shared_ptr<helics::helicsCLI11App> __thiscall
helics::NetworkBroker<helics::zeromq::ZmqCommsSS,_(gmlc::networking::InterfaceTypes)0,_1>::
generateCLI(NetworkBroker<helics::zeromq::ZmqCommsSS,_(gmlc::networking::InterfaceTypes)0,_1> *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  element_type *in_RDI;
  shared_ptr<helics::helicsCLI11App> sVar2;
  App *unaff_retaddr;
  App_p netApp;
  shared_ptr<helics::helicsCLI11App> *app;
  CoreBroker *in_stack_00000108;
  undefined1 in_stack_000015a7;
  NetworkBrokerData *in_stack_000015a8;
  string_view in_stack_000015b0;
  shared_ptr<CLI::App> *__r;
  shared_ptr<CLI::App> *this_00;
  char *in_stack_ffffffffffffff68;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff70;
  shared_ptr<CLI::App> local_38;
  shared_ptr<CLI::App> local_28;
  byte local_11;
  element_type *subcom;
  
  local_11 = 0;
  subcom = in_RDI;
  CoreBroker::generateCLI(in_stack_00000108);
  CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  NetworkBrokerData::commandLineParser(in_stack_000015a8,in_stack_000015b0,(bool)in_stack_000015a7);
  this_00 = &local_28;
  __r = &local_38;
  std::shared_ptr<CLI::App>::shared_ptr<helics::helicsCLI11App,void>
            (this_00,(shared_ptr<helics::helicsCLI11App> *)__r);
  CLI::std::shared_ptr<helics::helicsCLI11App>::~shared_ptr
            ((shared_ptr<helics::helicsCLI11App> *)0x4ab6f1);
  CLI::std::__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x4ab6fb);
  CLI::std::shared_ptr<CLI::App>::shared_ptr(this_00,__r);
  CLI::App::add_subcommand(unaff_retaddr,(App_p *)subcom);
  CLI::std::shared_ptr<CLI::App>::~shared_ptr((shared_ptr<CLI::App> *)0x4ab72f);
  local_11 = 1;
  CLI::std::shared_ptr<CLI::App>::~shared_ptr((shared_ptr<CLI::App> *)0x4ab744);
  _Var1._M_pi = extraout_RDX;
  if ((local_11 & 1) == 0) {
    CLI::std::shared_ptr<helics::helicsCLI11App>::~shared_ptr
              ((shared_ptr<helics::helicsCLI11App> *)0x4ab791);
    _Var1._M_pi = extraout_RDX_00;
  }
  sVar2.super___shared_ptr<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var1._M_pi;
  sVar2.super___shared_ptr<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<helics::helicsCLI11App>)
         sVar2.super___shared_ptr<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<helicsCLI11App> NetworkBroker<COMMS, baseline, tcode>::generateCLI()
{
    auto app = CoreBroker::generateCLI();
    CLI::App_p netApp = netInfo.commandLineParser(defInterface[static_cast<int>(baseline)], false);
    app->add_subcommand(netApp);
    return app;
}